

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int x509V3_add_len_value
              (char *name,char *value,size_t value_len,int omit_value,stack_st_CONF_VALUE **extlist)

{
  stack_st_CONF_VALUE *psVar1;
  void *pvVar2;
  stack_st_CONF_VALUE *psVar3;
  size_t sVar4;
  char *pcStack_50;
  int extlist_was_null;
  char *tvalue;
  char *tname;
  CONF_VALUE *vtmp;
  stack_st_CONF_VALUE **extlist_local;
  int omit_value_local;
  size_t value_len_local;
  char *value_local;
  char *name_local;
  
  tname = (char *)0x0;
  tvalue = (char *)0x0;
  pcStack_50 = (char *)0x0;
  psVar1 = *extlist;
  if ((name != (char *)0x0) && (tvalue = OPENSSL_strdup(name), tvalue == (char *)0x0))
  goto LAB_0076f992;
  if (omit_value == 0) {
    pvVar2 = OPENSSL_memchr(value,0,value_len);
    if (pvVar2 != (void *)0x0) {
      ERR_put_error(0x14,0,0xa3,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                    ,0x3d);
      goto LAB_0076f992;
    }
    pcStack_50 = OPENSSL_strndup(value,value_len);
    if (pcStack_50 == (char *)0x0) goto LAB_0076f992;
  }
  tname = (char *)CONF_VALUE_new();
  if ((CONF_VALUE *)tname != (CONF_VALUE *)0x0) {
    if (*extlist == (stack_st_CONF_VALUE *)0x0) {
      psVar3 = sk_CONF_VALUE_new_null();
      *extlist = psVar3;
      if (psVar3 == (stack_st_CONF_VALUE *)0x0) goto LAB_0076f992;
    }
    ((CONF_VALUE *)tname)->section = (char *)0x0;
    ((CONF_VALUE *)tname)->name = tvalue;
    ((CONF_VALUE *)tname)->value = pcStack_50;
    sVar4 = sk_CONF_VALUE_push(*extlist,(CONF_VALUE *)tname);
    if (sVar4 != 0) {
      return 1;
    }
  }
LAB_0076f992:
  if (psVar1 == (stack_st_CONF_VALUE *)0x0) {
    sk_CONF_VALUE_free(*extlist);
    *extlist = (stack_st_CONF_VALUE *)0x0;
  }
  OPENSSL_free(tname);
  OPENSSL_free(tvalue);
  OPENSSL_free(pcStack_50);
  return 0;
}

Assistant:

static int x509V3_add_len_value(const char *name, const char *value,
                                size_t value_len, int omit_value,
                                STACK_OF(CONF_VALUE) **extlist) {
  CONF_VALUE *vtmp = NULL;
  char *tname = NULL, *tvalue = NULL;
  int extlist_was_null = *extlist == NULL;
  if (name && !(tname = OPENSSL_strdup(name))) {
    goto err;
  }
  if (!omit_value) {
    // |CONF_VALUE| cannot represent strings with NULs.
    if (OPENSSL_memchr(value, 0, value_len)) {
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_VALUE);
      goto err;
    }
    tvalue = OPENSSL_strndup(value, value_len);
    if (tvalue == NULL) {
      goto err;
    }
  }
  if (!(vtmp = CONF_VALUE_new())) {
    goto err;
  }
  if (!*extlist && !(*extlist = sk_CONF_VALUE_new_null())) {
    goto err;
  }
  vtmp->section = NULL;
  vtmp->name = tname;
  vtmp->value = tvalue;
  if (!sk_CONF_VALUE_push(*extlist, vtmp)) {
    goto err;
  }
  return 1;
err:
  if (extlist_was_null) {
    sk_CONF_VALUE_free(*extlist);
    *extlist = NULL;
  }
  OPENSSL_free(vtmp);
  OPENSSL_free(tname);
  OPENSSL_free(tvalue);
  return 0;
}